

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O0

void jsoncons::bson::detail::mul_64x64(uint64_t left,uint64_t right,bson_uint128_6464_t *product)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  bson_uint128_6464_t rt;
  uint64_t product_low;
  uint64_t product_mid2;
  uint64_t product_mid;
  uint64_t product_high;
  uint64_t right_low;
  uint64_t right_high;
  uint64_t left_low;
  uint64_t left_high;
  long local_68;
  long local_60;
  long *local_18;
  ulong local_10;
  ulong local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_68,0,0x10);
  if ((local_8 == 0) && (local_10 == 0)) {
    *local_18 = local_68;
    local_18[1] = local_60;
  }
  else {
    uVar1 = (local_8 >> 0x20) * (local_10 & 0xffffffff);
    uVar2 = (local_8 & 0xffffffff) * (local_10 & 0xffffffff);
    uVar3 = (uVar1 & 0xffffffff) + (local_8 & 0xffffffff) * (local_10 >> 0x20) + (uVar2 >> 0x20);
    *local_18 = (uVar1 >> 0x20) + (local_8 >> 0x20) * (local_10 >> 0x20) + (uVar3 >> 0x20);
    local_18[1] = (uVar3 << 0x20) + (uVar2 & 0xffffffff);
  }
  return;
}

Assistant:

inline
        void mul_64x64 (uint64_t left,                 /* IN */
                        uint64_t right,                /* IN */
                        bson_uint128_6464_t *product) /* OUT */
        {
            uint64_t left_high, left_low, right_high, right_low, product_high,
               product_mid, product_mid2, product_low;
            bson_uint128_6464_t rt = {0,0};
 
            if (!left && !right) {
               *product = rt;
               return;
            }
 
            left_high = left >> 32;
            left_low = (uint32_t) left;
            right_high = right >> 32;
            right_low = (uint32_t) right;
 
            product_high = left_high * right_high;
            product_mid = left_high * right_low;
            product_mid2 = left_low * right_high;
            product_low = left_low * right_low;
 
            product_high += product_mid >> 32;
            product_mid = (uint32_t) product_mid + product_mid2 + (product_low >> 32);
 
            product_high = product_high + (product_mid >> 32);
            product_low = (product_mid << 32) + (uint32_t) product_low;
 
            rt.high = product_high;
            rt.low = product_low;
            *product = rt;
        }